

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void instrFunc(sqlite3_context *context,int argc,sqlite3_value **argv)

{
  uchar uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uchar *__s1;
  uchar *__s2;
  byte bVar5;
  ushort uVar6;
  int iVal;
  
  uVar6 = (*argv)->flags & 0x3f;
  bVar5 = (byte)argv[1]->flags & 0x3f;
  if ((((uint)(0xaaaaaaaaaaaaaaaa >> bVar5) | (uint)(0xaaaaaaaaaaaaaaaa >> (sbyte)uVar6)) & 1) != 0)
  {
    return;
  }
  iVar2 = sqlite3_value_bytes(*argv);
  uVar3 = sqlite3_value_bytes(argv[1]);
  if ((int)uVar3 < 1) {
    iVal = 1;
  }
  else {
    if (((byte)(0x1000000010001 >> bVar5) & (0x1000000010001U >> uVar6 & 1) != 0) == 1) {
      __s1 = (uchar *)sqlite3_value_blob(*argv);
      __s2 = (uchar *)sqlite3_value_blob(argv[1]);
    }
    else {
      __s1 = sqlite3_value_text(*argv);
      __s2 = sqlite3_value_text(argv[1]);
    }
    if (__s2 == (uchar *)0x0) {
      return;
    }
    if (iVar2 != 0 && __s1 == (uchar *)0x0) {
      return;
    }
    uVar1 = *__s2;
    iVal = 1;
    for (; (int)uVar3 <= iVar2; iVar2 = iVar2 + -1) {
      if ((*__s1 == uVar1) && (iVar4 = bcmp(__s1,__s2,(ulong)uVar3), iVar4 == 0)) goto LAB_001ab216;
      iVal = iVal + 1;
      __s1 = __s1 + 1;
    }
    iVal = 0;
  }
LAB_001ab216:
  sqlite3_result_int(context,iVal);
  return;
}

Assistant:

static void instrFunc(
  sqlite3_context *context,
  int argc,
  sqlite3_value **argv
){
  const unsigned char *zHaystack;
  const unsigned char *zNeedle;
  int nHaystack;
  int nNeedle;
  int typeHaystack, typeNeedle;
  int N = 1;
  int isText;
  unsigned char firstChar;

  UNUSED_PARAMETER(argc);
  typeHaystack = sqlite3_value_type(argv[0]);
  typeNeedle = sqlite3_value_type(argv[1]);
  if( typeHaystack==SQLITE_NULL || typeNeedle==SQLITE_NULL ) return;
  nHaystack = sqlite3_value_bytes(argv[0]);
  nNeedle = sqlite3_value_bytes(argv[1]);
  if( nNeedle>0 ){
    if( typeHaystack==SQLITE_BLOB && typeNeedle==SQLITE_BLOB ){
      zHaystack = sqlite3_value_blob(argv[0]);
      zNeedle = sqlite3_value_blob(argv[1]);
      isText = 0;
    }else{
      zHaystack = sqlite3_value_text(argv[0]);
      zNeedle = sqlite3_value_text(argv[1]);
      isText = 1;
    }
    if( zNeedle==0 || (nHaystack && zHaystack==0) ) return;
    firstChar = zNeedle[0];
    while( nNeedle<=nHaystack
       && (zHaystack[0]!=firstChar || memcmp(zHaystack, zNeedle, nNeedle)!=0)
    ){
      N++;
      do{
        nHaystack--;
        zHaystack++;
      }while( isText && (zHaystack[0]&0xc0)==0x80 );
    }
    if( nNeedle>nHaystack ) N = 0;
  }
  sqlite3_result_int(context, N);
}